

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bif.c
# Opt level: O0

void bifstrlwr(uchar *str,int len)

{
  int iVar1;
  ushort **ppuVar2;
  int in_ESI;
  byte *in_RDI;
  int local_c;
  byte *local_8;
  
  local_8 = in_RDI;
  for (local_c = in_ESI; local_c != 0; local_c = local_c + -1) {
    if ((*local_8 == 0x5c) && (1 < local_c)) {
      local_c = local_c + -1;
      local_8 = local_8 + 1;
    }
    else {
      ppuVar2 = __ctype_b_loc();
      if (((*ppuVar2)[(int)(uint)*local_8] & 0x100) != 0) {
        iVar1 = tolower((uint)*local_8);
        *local_8 = (byte)iVar1;
      }
    }
    local_8 = local_8 + 1;
  }
  return;
}

Assistant:

static void bifstrlwr(uchar *str, int len)
{
    for ( ; len ; --len, ++str)
    {
        if (*str == '\\' && len > 1)
            --len, ++str;
        else if (isupper(*str))
            *str = tolower(*str);
    }
}